

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

int mpz_div_qr(__mpz_struct *q,__mpz_struct *r,__mpz_struct *n,__mpz_struct *d,
              mpz_div_round_mode mode)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  mp_size_t mVar5;
  long local_c8;
  int local_c0;
  long local_b8;
  long local_b0;
  undefined1 local_a8 [8];
  mpz_t tr;
  mpz_t tq;
  mp_size_t rn;
  mp_size_t qn;
  mp_ptr qp;
  mp_ptr np;
  mp_size_t qs;
  mp_size_t dn;
  mp_size_t nn;
  mp_size_t ds;
  mp_size_t ns;
  mpz_div_round_mode mode_local;
  __mpz_struct *d_local;
  __mpz_struct *n_local;
  __mpz_struct *r_local;
  __mpz_struct *q_local;
  
  uVar1 = n->_mp_size;
  lVar3 = (long)(int)uVar1;
  uVar2 = d->_mp_size;
  local_b8 = (long)(int)uVar2;
  if (local_b8 == 0) {
    gmp_die("mpz_div_qr: Divide by zero.");
  }
  if (lVar3 == 0) {
    if (q != (__mpz_struct *)0x0) {
      q->_mp_size = 0;
    }
    if (r != (__mpz_struct *)0x0) {
      r->_mp_size = 0;
    }
    q_local._4_4_ = 0;
  }
  else {
    local_b0 = lVar3;
    if (lVar3 < 0) {
      local_b0 = -lVar3;
    }
    if (local_b8 < 0) {
      local_b8 = -local_b8;
    }
    uVar2 = uVar2 ^ uVar1;
    if (local_b0 < local_b8) {
      if ((mode == GMP_DIV_CEIL) && (-1 < (int)uVar2)) {
        if (r != (__mpz_struct *)0x0) {
          mpz_sub(r,n,d);
        }
        if (q != (__mpz_struct *)0x0) {
          mpz_set_ui(q,1);
        }
      }
      else if ((mode == GMP_DIV_FLOOR) && ((int)uVar2 < 0)) {
        if (r != (__mpz_struct *)0x0) {
          mpz_add(r,n,d);
        }
        if (q != (__mpz_struct *)0x0) {
          mpz_set_si(q,-1);
        }
      }
      else {
        if (r != (__mpz_struct *)0x0) {
          mpz_set(r,n);
        }
        if (q != (__mpz_struct *)0x0) {
          q->_mp_size = 0;
        }
      }
      q_local._4_4_ = 1;
    }
    else {
      mpz_init_set((__mpz_struct *)local_a8,n);
      lVar4 = (local_b0 - local_b8) + 1;
      if (q == (__mpz_struct *)0x0) {
        qn = 0;
      }
      else {
        mpz_init2((__mpz_struct *)&tr[0]._mp_d,lVar4 * 0x40);
        qn = tq[0]._0_8_;
      }
      mpn_div_qr((mp_ptr)qn,(mp_ptr)tr[0]._0_8_,local_b0,d->_mp_d,local_b8);
      if (qn != 0) {
        local_c0 = (int)lVar4 - (uint)(*(long *)(qn + (local_b0 - local_b8) * 8) == 0);
        if ((int)uVar2 < 0) {
          local_c0 = -local_c0;
        }
        tr[0]._mp_d._4_4_ = local_c0;
      }
      mVar5 = mpn_normalized_size((mp_srcptr)tr[0]._0_8_,local_b8);
      local_c8 = mVar5;
      if (lVar3 < 0) {
        local_c8 = -mVar5;
      }
      local_a8._4_4_ = (undefined4)local_c8;
      if (((mode == GMP_DIV_FLOOR) && ((int)uVar2 < 0)) && (mVar5 != 0)) {
        if (q != (__mpz_struct *)0x0) {
          mpz_sub_ui((__mpz_struct *)&tr[0]._mp_d,(__mpz_struct *)&tr[0]._mp_d,1);
        }
        if (r != (__mpz_struct *)0x0) {
          mpz_add((__mpz_struct *)local_a8,(__mpz_struct *)local_a8,d);
        }
      }
      else if (((mode == GMP_DIV_CEIL) && (-1 < (int)uVar2)) && (mVar5 != 0)) {
        if (q != (__mpz_struct *)0x0) {
          mpz_add_ui((__mpz_struct *)&tr[0]._mp_d,(__mpz_struct *)&tr[0]._mp_d,1);
        }
        if (r != (__mpz_struct *)0x0) {
          mpz_sub((__mpz_struct *)local_a8,(__mpz_struct *)local_a8,d);
        }
      }
      if (q != (__mpz_struct *)0x0) {
        mpz_swap((__mpz_struct *)&tr[0]._mp_d,q);
        mpz_clear((__mpz_struct *)&tr[0]._mp_d);
      }
      if (r != (__mpz_struct *)0x0) {
        mpz_swap((__mpz_struct *)local_a8,r);
      }
      mpz_clear((__mpz_struct *)local_a8);
      q_local._4_4_ = (uint)(mVar5 != 0);
    }
  }
  return q_local._4_4_;
}

Assistant:

static int
mpz_div_qr (mpz_t q, mpz_t r,
	    const mpz_t n, const mpz_t d, enum mpz_div_round_mode mode)
{
  mp_size_t ns, ds, nn, dn, qs;
  ns = n->_mp_size;
  ds = d->_mp_size;

  if (ds == 0)
    gmp_die("mpz_div_qr: Divide by zero.");

  if (ns == 0)
    {
      if (q)
	q->_mp_size = 0;
      if (r)
	r->_mp_size = 0;
      return 0;
    }

  nn = GMP_ABS (ns);
  dn = GMP_ABS (ds);

  qs = ds ^ ns;

  if (nn < dn)
    {
      if (mode == GMP_DIV_CEIL && qs >= 0)
	{
	  /* q = 1, r = n - d */
	  if (r)
	    mpz_sub (r, n, d);
	  if (q)
	    mpz_set_ui (q, 1);
	}
      else if (mode == GMP_DIV_FLOOR && qs < 0)
	{
	  /* q = -1, r = n + d */
	  if (r)
	    mpz_add (r, n, d);
	  if (q)
	    mpz_set_si (q, -1);
	}
      else
	{
	  /* q = 0, r = d */
	  if (r)
	    mpz_set (r, n);
	  if (q)
	    q->_mp_size = 0;
	}
      return 1;
    }
  else
    {
      mp_ptr np, qp;
      mp_size_t qn, rn;
      mpz_t tq, tr;

      mpz_init_set (tr, n);
      np = tr->_mp_d;

      qn = nn - dn + 1;

      if (q)
	{
	  mpz_init2 (tq, qn * GMP_LIMB_BITS);
	  qp = tq->_mp_d;
	}
      else
	qp = NULL;

      mpn_div_qr (qp, np, nn, d->_mp_d, dn);

      if (qp)
	{
	  qn -= (qp[qn-1] == 0);

	  tq->_mp_size = qs < 0 ? -qn : qn;
	}
      rn = mpn_normalized_size (np, dn);
      tr->_mp_size = ns < 0 ? - rn : rn;

      if (mode == GMP_DIV_FLOOR && qs < 0 && rn != 0)
	{
	  if (q)
	    mpz_sub_ui (tq, tq, 1);
	  if (r)
	    mpz_add (tr, tr, d);
	}
      else if (mode == GMP_DIV_CEIL && qs >= 0 && rn != 0)
	{
	  if (q)
	    mpz_add_ui (tq, tq, 1);
	  if (r)
	    mpz_sub (tr, tr, d);
	}

      if (q)
	{
	  mpz_swap (tq, q);
	  mpz_clear (tq);
	}
      if (r)
	mpz_swap (tr, r);

      mpz_clear (tr);

      return rn != 0;
    }
}